

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool xatlas::internal::Fit::EigenSolver3_QLAlgorithm(float (*mat) [3],float *diag,float *subd)

{
  float fVar1;
  int ell;
  ulong uVar2;
  int iter;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar2 = 0;
LAB_001a2319:
  if (uVar2 == 3) {
LAB_001a254e:
    return 2 < uVar2;
  }
  iVar3 = 0;
  do {
    if (iVar3 == 0x20) goto LAB_001a254e;
    uVar8 = uVar2;
    uVar7 = uVar2 & 0xffffffff;
    do {
      uVar6 = uVar7;
      uVar4 = uVar8;
      if (uVar4 == 2) break;
      fVar10 = ABS((diag + uVar4)[1]) + ABS(diag[uVar4]);
      uVar7 = (ulong)((int)uVar6 + 1);
      uVar8 = uVar4 + 1;
    } while ((ABS(subd[uVar4]) + fVar10 != fVar10) ||
            (NAN(ABS(subd[uVar4]) + fVar10) || NAN(fVar10)));
    uVar4 = uVar4 & 0xffffffff;
    if (uVar4 == uVar2) break;
    fVar10 = subd[uVar2];
    fVar12 = (diag[uVar2 + 1] - diag[uVar2]) / (fVar10 + fVar10);
    fVar13 = SQRT(fVar12 * fVar12 + 1.0);
    fVar11 = 0.0;
    fVar12 = fVar10 / ((float)((uint)-fVar13 & -(uint)(fVar12 < 0.0) |
                              ~-(uint)(fVar12 < 0.0) & (uint)fVar13) + fVar12) +
             (diag[uVar4] - diag[uVar2]);
    pfVar5 = *mat + uVar6;
    fVar13 = 1.0;
    uVar8 = uVar4;
    fVar10 = 1.0;
    while( true ) {
      if ((long)uVar8 <= (long)uVar2) break;
      uVar7 = uVar8 - 1;
      fVar13 = fVar13 * subd[uVar7];
      if (ABS(fVar12) <= ABS(fVar13)) {
        fVar15 = fVar12 / fVar13;
        fVar14 = SQRT(fVar15 * fVar15 + 1.0);
        fVar12 = fVar13 * fVar14;
        fVar13 = 1.0 / fVar14;
        fVar15 = fVar15 * fVar13;
      }
      else {
        fVar13 = fVar13 / fVar12;
        fVar15 = SQRT(fVar13 * fVar13 + 1.0);
        fVar12 = fVar12 * fVar15;
        fVar15 = 1.0 / fVar15;
        fVar13 = fVar13 * fVar15;
      }
      fVar10 = fVar10 * subd[uVar7];
      subd[uVar8] = fVar12;
      fVar14 = diag[uVar8] - fVar11;
      fVar12 = (diag[uVar7] - fVar14) * fVar13 + (fVar10 + fVar10) * fVar15;
      fVar11 = fVar13 * fVar12;
      diag[uVar8] = fVar14 + fVar11;
      for (lVar9 = 0; lVar9 != 0x24; lVar9 = lVar9 + 0xc) {
        fVar14 = *(float *)((long)pfVar5 + lVar9 + -4);
        fVar1 = *(float *)((long)pfVar5 + lVar9);
        *(float *)((long)pfVar5 + lVar9) = fVar13 * fVar14 + fVar15 * fVar1;
        *(float *)((long)pfVar5 + lVar9 + -4) = fVar14 * fVar15 + fVar1 * -fVar13;
      }
      fVar12 = fVar12 * fVar15 + -fVar10;
      pfVar5 = pfVar5 + -1;
      uVar8 = uVar7;
      fVar10 = fVar15;
    }
    diag[uVar2] = diag[uVar2] - fVar11;
    subd[uVar2] = fVar12;
    subd[uVar4] = 0.0;
    iVar3 = iVar3 + 1;
  } while( true );
  uVar2 = uVar2 + 1;
  goto LAB_001a2319;
}

Assistant:

static bool EigenSolver3_QLAlgorithm(float mat[3][3], float *diag, float *subd)
	{
		// QL iteration with implicit shifting to reduce matrix from tridiagonal
		// to diagonal
		const int maxiter = 32;
		for (int ell = 0; ell < 3; ell++) {
			int iter;
			for (iter = 0; iter < maxiter; iter++) {
				int m;
				for (m = ell; m <= 1; m++) {
					float dd = fabsf(diag[m]) + fabsf(diag[m + 1]);
					if ( fabsf(subd[m]) + dd == dd )
						break;
				}
				if ( m == ell )
					break;
				float g = (diag[ell + 1] - diag[ell]) / (2 * subd[ell]);
				float r = sqrtf(g * g + 1);
				if ( g < 0 )
					g = diag[m] - diag[ell] + subd[ell] / (g - r);
				else
					g = diag[m] - diag[ell] + subd[ell] / (g + r);
				float s = 1, c = 1, p = 0;
				for (int i = m - 1; i >= ell; i--) {
					float f = s * subd[i], b = c * subd[i];
					if ( fabsf(f) >= fabsf(g) ) {
						c = g / f;
						r = sqrtf(c * c + 1);
						subd[i + 1] = f * r;
						c *= (s = 1 / r);
					} else {
						s = f / g;
						r = sqrtf(s * s + 1);
						subd[i + 1] = g * r;
						s *= (c = 1 / r);
					}
					g = diag[i + 1] - p;
					r = (diag[i] - g) * s + 2 * b * c;
					p = s * r;
					diag[i + 1] = g + p;
					g = c * r - b;
					for (int k = 0; k < 3; k++) {
						f = mat[k][i + 1];
						mat[k][i + 1] = s * mat[k][i] + c * f;
						mat[k][i] = c * mat[k][i] - s * f;
					}
				}
				diag[ell] -= p;
				subd[ell] = g;
				subd[m] = 0;
			}
			if ( iter == maxiter )
				// should not get here under normal circumstances
				return false;
		}
		return true;
	}